

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.cpp
# Opt level: O0

void * __thiscall phyr::MemoryPool::alloc(MemoryPool *this,size_t byteCount)

{
  bool bVar1;
  pointer ppVar2;
  unsigned_long *puVar3;
  _List_node_base *p_Var4;
  long in_RSI;
  const_iterator in_RDI;
  void *ptr;
  iterator it;
  list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  *in_stack_ffffffffffffffa8;
  list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  *this_00;
  MemoryPool *in_stack_ffffffffffffffc0;
  _List_const_iterator<std::pair<unsigned_char_*,_unsigned_long>_> local_28;
  _Self local_20;
  _Self local_18;
  ulong local_10 [2];
  
  local_10[0] = in_RSI + 0xfU & 0xfffffffffffffff0;
  if (in_RDI._M_node[1]._M_prev <
      (_List_node_base *)((long)&(in_RDI._M_node[1]._M_next)->_M_next + local_10[0])) {
    stash(in_stack_ffffffffffffffc0);
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    while( true ) {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
           ::end(in_stack_ffffffffffffffa8);
      bVar1 = std::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      ppVar2 = std::_List_iterator<std::pair<unsigned_char_*,_unsigned_long>_>::operator->
                         ((_List_iterator<std::pair<unsigned_char_*,_unsigned_long>_> *)0x109233);
      if (local_10[0] <= ppVar2->second) {
        ppVar2 = std::_List_iterator<std::pair<unsigned_char_*,_unsigned_long>_>::operator->
                           ((_List_iterator<std::pair<unsigned_char_*,_unsigned_long>_> *)0x109248);
        in_RDI._M_node[2]._M_next = (_List_node_base *)ppVar2->first;
        ppVar2 = std::_List_iterator<std::pair<unsigned_char_*,_unsigned_long>_>::operator->
                           ((_List_iterator<std::pair<unsigned_char_*,_unsigned_long>_> *)0x109261);
        in_RDI._M_node[1]._M_prev = (_List_node_base *)ppVar2->second;
        this_00 = (list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                   *)&in_RDI._M_node[2]._M_prev;
        std::_List_const_iterator<std::pair<unsigned_char_*,_unsigned_long>_>::_List_const_iterator
                  (&local_28,&local_18);
        std::__cxx11::
        list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
        ::erase(this_00,in_RDI);
        break;
      }
      std::_List_iterator<std::pair<unsigned_char_*,_unsigned_long>_>::operator++(&local_18,0);
    }
    if (in_RDI._M_node[2]._M_next == (_List_node_base *)0x0) {
      puVar3 = std::max<unsigned_long>(local_10,(unsigned_long *)in_RDI._M_node);
      in_RDI._M_node[1]._M_prev = (_List_node_base *)*puVar3;
      p_Var4 = (_List_node_base *)allocAligned<unsigned_char>(0x1092ea);
      in_RDI._M_node[2]._M_next = p_Var4;
      (in_RDI._M_node)->_M_prev =
           (_List_node_base *)
           ((long)&(in_RDI._M_node)->_M_prev->_M_next + (long)&(in_RDI._M_node[1]._M_prev)->_M_next)
      ;
    }
    in_RDI._M_node[1]._M_next = (_List_node_base *)0x0;
  }
  p_Var4 = in_RDI._M_node[1]._M_next;
  in_RDI._M_node[1]._M_next =
       (_List_node_base *)((long)&(in_RDI._M_node[1]._M_next)->_M_next + local_10[0]);
  return (void *)((long)&p_Var4->_M_next + (long)&(in_RDI._M_node[2]._M_next)->_M_next);
}

Assistant:

void* MemoryPool::alloc(size_t byteCount) {
    // Align {size} with cache line size
    // Optimized alignment calculation, as {MachineAlignment} is a power of 2
    byteCount = (byteCount + MachineAlignment - 1) & ~(MachineAlignment - 1);

    // Check if size requirement is more than what is curently available
    if (curBlockOffset + byteCount > curAllocSize) {
        // Store current block usage data
        stash();

        // Check free blocks for memory
        for (auto it = freeBlocks.begin(); it != freeBlocks.end(); it++) {
            if (it->second >= byteCount) {
                blockPtr = it->first; curAllocSize = it->second;
                // Remove this block from the free set
                freeBlocks.erase(it);
                break;
            }
        }

        // If a block has not yet been found, allocate new
        if (!blockPtr) {
            // Ensure minimum of {blockSize} bytes per block
            curAllocSize = std::max(byteCount, blockSize);
            blockPtr = allocAligned<uint8_t>(curAllocSize);
            // Increment pool size stat
            totalAllocSize += curAllocSize;
        }

        // New memory block allocated, reset block offset
        curBlockOffset = 0;
    }

    void* ptr = blockPtr + curBlockOffset;
    curBlockOffset += byteCount;
    return ptr;
}